

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.h
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoWriter::ProtoElement::~ProtoElement(ProtoElement *this)

{
  (this->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__ProtoElement_003e3e78;
  (this->super_LocationTrackerInterface)._vptr_LocationTrackerInterface =
       (_func_int **)&PTR__ProtoElement_003e3ea8;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->oneof_indices_).super__Bvector_base<std::allocator<bool>_>);
  std::
  _Rb_tree<const_google::protobuf::Field_*,_const_google::protobuf::Field_*,_std::_Identity<const_google::protobuf::Field_*>,_std::less<const_google::protobuf::Field_*>,_std::allocator<const_google::protobuf::Field_*>_>
  ::~_Rb_tree(&(this->required_fields_)._M_t);
  StructuredObjectWriter::BaseElement::~BaseElement(&this->super_BaseElement);
  return;
}

Assistant:

~ProtoElement() override {}